

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

apx_error_t serializer_pack_byte_array_internal(apx_vm_serializer_t *self)

{
  uint uVar1;
  uint8_t *__dest;
  dtl_sv_type_id dVar2;
  uint32_t uVar3;
  adt_bytearray_t *self_00;
  uint8_t *__src;
  apx_error_t local_2c;
  apx_error_t retval;
  adt_bytearray_t *byte_array;
  uint32_t array_len;
  apx_vm_serializer_t *self_local;
  
  if (self->state == (apx_vm_writeState_t *)0x0) {
    __assert_fail("self->state != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                  ,0x67d,"apx_error_t serializer_pack_byte_array_internal(apx_vm_serializer_t *)");
  }
  if ((self->state->value_type == DTL_DV_SCALAR) &&
     (dVar2 = dtl_sv_type((self->state->value).sv), dVar2 == DTL_SV_BYTEARRAY)) {
    uVar1 = self->state->array_len;
    self_00 = dtl_sv_get_bytearray((self->state->value).sv);
    if (self_00 == (adt_bytearray_t *)0x0) {
      __assert_fail("byte_array != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                    ,0x685,"apx_error_t serializer_pack_byte_array_internal(apx_vm_serializer_t *)")
      ;
    }
    if (((self->state->dynamic_size_type == '\0') && (uVar1 != 0)) &&
       (uVar3 = adt_bytearray_length(self_00), uVar1 != uVar3)) {
      self_local._4_4_ = 0x46;
    }
    else {
      local_2c = 0;
      if ((self->buffer).end < (self->buffer).next + uVar1) {
        local_2c = 0x25;
      }
      else {
        __dest = (self->buffer).next;
        __src = adt_bytearray_data(self_00);
        memcpy(__dest,__src,(ulong)uVar1);
        (self->buffer).next = (self->buffer).next + uVar1;
      }
      self_local._4_4_ = local_2c;
    }
  }
  else {
    self_local._4_4_ = 0x43;
  }
  return self_local._4_4_;
}

Assistant:

static apx_error_t serializer_pack_byte_array_internal(apx_vm_serializer_t* self)
{
   assert(self->state != NULL);
   if ((self->state->value_type != DTL_DV_SCALAR) ||
      (dtl_sv_type(self->state->value.sv) != DTL_SV_BYTEARRAY))
   {
      return APX_VALUE_TYPE_ERROR;
   }
   uint32_t const array_len = self->state->array_len;
   adt_bytearray_t const* byte_array = dtl_sv_get_bytearray(self->state->value.sv);
   assert(byte_array != NULL);
   if ((self->state->dynamic_size_type == APX_SIZE_TYPE_NONE) && (array_len > 0u))
   {
      if (array_len != adt_bytearray_length(byte_array)) //For non-dynamic arrays the length of the value must match exactly.
      {
         return APX_VALUE_LENGTH_ERROR;
      }
   }
   apx_error_t retval = APX_NO_ERROR;
   if ((self->buffer.next + array_len) <= self->buffer.end)
   {
      memcpy(self->buffer.next, adt_bytearray_data(byte_array), array_len);
      self->buffer.next += array_len;
   }
   else
   {
      retval = APX_BUFFER_BOUNDARY_ERROR;
   }
   return retval;
}